

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsThermalEngine.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsThermalEngine::ArchiveOUT(ChShaftsThermalEngine *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChShaftsThermalEngine>(marchive);
  ChShaftsTorqueBase::ArchiveOUT(&this->super_ChShaftsTorqueBase,marchive);
  local_38._value = &this->Tw;
  local_38._name = "Tw";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFunction>(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->throttle;
  local_38._name = "throttle";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ChShaftsThermalEngine::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChShaftsThermalEngine>();

    // serialize parent class
    ChShaftsTorqueBase::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(Tw);
    marchive << CHNVP(throttle);
}